

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

bool __thiscall
ctemplate::SectionTemplateNode::Expand
          (SectionTemplateNode *this,ExpandEmitter *output_buffer,
          TemplateDictionaryInterface *dictionary,PerExpandData *per_expand_data,
          TemplateCache *cache)

{
  HashedTemplateString *pHVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  long *plVar5;
  undefined8 uVar6;
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar7;
  undefined4 extraout_var;
  
  if ((this->token_).text == "__{{MAIN}}__") {
    UNRECOVERED_JUMPTABLE = (this->super_TemplateNode)._vptr_TemplateNode[5];
  }
  else {
    pHVar1 = &this->variable_;
    if (this->hidden_by_default_ == true) {
      iVar4 = (*dictionary->_vptr_TemplateDictionaryInterface[9])(dictionary,pHVar1);
      if ((char)iVar4 == '\0') {
        return true;
      }
    }
    else {
      iVar4 = (*dictionary->_vptr_TemplateDictionaryInterface[3])(dictionary,pHVar1);
      if ((char)iVar4 != '\0') {
        return true;
      }
    }
    iVar4 = (*dictionary->_vptr_TemplateDictionaryInterface[8])(dictionary,pHVar1);
    plVar5 = (long *)CONCAT44(extraout_var,iVar4);
    cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5);
    if (cVar2 != '\0') {
      bVar7 = true;
      while( true ) {
        cVar2 = (**(code **)(*plVar5 + 0x10))(plVar5);
        if (cVar2 == '\0') break;
        uVar6 = (**(code **)(*plVar5 + 0x18))(plVar5);
        bVar3 = (**(code **)(*plVar5 + 0x10))(plVar5);
        iVar4 = (*(this->super_TemplateNode)._vptr_TemplateNode[5])
                          (this,output_buffer,uVar6,per_expand_data,(ulong)(bVar3 ^ 1),cache);
        bVar7 = (bool)(bVar7 & (byte)iVar4);
      }
      (**(code **)(*plVar5 + 8))(plVar5);
      return bVar7;
    }
    (**(code **)(*plVar5 + 8))(plVar5);
    UNRECOVERED_JUMPTABLE = (this->super_TemplateNode)._vptr_TemplateNode[5];
  }
  iVar4 = (*UNRECOVERED_JUMPTABLE)(this,output_buffer,dictionary,per_expand_data,1,cache);
  return SUB41(iVar4,0);
}

Assistant:

bool SectionTemplateNode::Expand(
    ExpandEmitter *output_buffer,
    const TemplateDictionaryInterface *dictionary,
    PerExpandData *per_expand_data,
    const TemplateCache *cache) const {
  // The section named __{{MAIN}}__ is special: you always expand it
  // exactly once using the containing (main) dictionary.
  if (token_.text == kMainSectionName) {
    return ExpandOnce(output_buffer, dictionary, per_expand_data, true, cache);
  } else if (hidden_by_default_ ?
             !dictionary->IsUnhiddenSection(variable_) :
             dictionary->IsHiddenSection(variable_)) {
    // Some dictionaries might have sections that can be explicitly hidden
    // and unhidden, so by default both IsHidden() and IsUnhidden() are false,
    // in which case hidden_by_default_ controls the behavior.
    return true;      // if this section is "hidden", do nothing
  }

  TemplateDictionaryInterface::Iterator* di =
      dictionary->CreateSectionIterator(variable_);

  // If there are no child dictionaries, that means we should expand with the
  // current dictionary instead. This corresponds to the situation where
  // template variables within a section are set on the template-wide dictionary
  // instead of adding a dictionary to the section and setting them there.
  if (!di->HasNext()) {
    delete di;
    return ExpandOnce(output_buffer, dictionary, per_expand_data,
                      true, cache);
  }

  // Otherwise, there's at least one child dictionary, and when expanding this
  // section, we should use the child dictionaries instead of the current one.
  bool error_free = true;
  while (di->HasNext()) {
    const TemplateDictionaryInterface& child = di->Next();
    error_free &= ExpandOnce(output_buffer, &child, per_expand_data,
                             !di->HasNext(), cache);
  }
  delete di;
  return error_free;
}